

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyzer.cpp
# Opt level: O2

void __thiscall
SemanticAnalyzerRun::onEnterFunctionInvocationExpressionAstNode
          (SemanticAnalyzerRun *this,FunctionInvocationExpressionAstNode *node)

{
  string local_48;
  allocator<char> local_21;
  
  Scope::find((optional<VariableDefinition> *)&local_48,
              (this->currentScope).super___shared_ptr<Scope,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
              &((node->identifier).super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               value,true);
  std::_Optional_payload_base<VariableDefinition>::_M_reset
            ((_Optional_payload_base<VariableDefinition> *)&local_48);
  if (local_48.field_2._M_local_buf[8] == '\0') {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"Undefined reference in function invocation.",&local_21);
    reportError(this,&node->identifier,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return;
}

Assistant:

void onEnterFunctionInvocationExpressionAstNode(FunctionInvocationExpressionAstNode*  node) noexcept override {
    if (!this->currentScope->find(node->identifier->value, true)) {
      this->reportError(node->identifier, "Undefined reference in function invocation.");
    }
  }